

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O1

void rsg::(anonymous_namespace)::convertValueRangeTempl<bool,float>
               (ConstValueRangeAccess src,ValueRangeAccess dst)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0x3f800000;
  iVar2 = 0x3f800000;
  if ((src.m_min)->boolVal == false) {
    iVar2 = 0;
  }
  if ((src.m_max)->boolVal == false) {
    iVar1 = 0;
  }
  (dst.super_ConstValueRangeAccess.m_min)->intVal = iVar2;
  (dst.super_ConstValueRangeAccess.m_max)->intVal = iVar1;
  return;
}

Assistant:

ConstValueAccess			getMax					(void) const	{ return ConstValueAccess(*m_type, m_max);	}